

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerNewConcatStrMultiBE(Lowerer *this,Instr *instr)

{
  RegOpnd *baseOpnd;
  IntConstOpnd *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  uint32 offset;
  undefined4 *puVar4;
  StackSym *pSVar5;
  Instr *pIVar6;
  IndirOpnd *dstOpnd;
  Opnd *pOVar7;
  Instr *this_02;
  Opnd *local_48;
  
  pOVar7 = instr->m_src1;
  OVar2 = IR::Opnd::GetKind(pOVar7);
  if (OVar2 != OpndKindIntConst) {
    OVar2 = IR::Opnd::GetKind(pOVar7);
    if (OVar2 != OpndKindInt64Const) {
      OVar2 = IR::Opnd::GetKind(pOVar7);
      if (OVar2 != OpndKindAddr) {
        OVar2 = IR::Opnd::GetKind(pOVar7);
        if (OVar2 != OpndKindHelperCall) {
          OVar2 = IR::Opnd::GetKind(pOVar7);
          if (OVar2 != OpndKindFloatConst) {
            OVar2 = IR::Opnd::GetKind(pOVar7);
            if (OVar2 != OpndKindSimd128Const) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar4 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x65dd,"(instr->GetSrc1()->IsConstOpnd())",
                                 "instr->GetSrc1()->IsConstOpnd()");
              if (!bVar3) goto LAB_005bea8d;
              *puVar4 = 0;
            }
          }
        }
      }
    }
  }
  OVar2 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65de,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
    if (!bVar3) goto LAB_005bea8d;
    *puVar4 = 0;
  }
  baseOpnd = (RegOpnd *)instr->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005bea8d;
    *puVar4 = 0;
  }
  this_00 = (IntConstOpnd *)instr->m_src1;
  OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar2 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_005bea8d;
    *puVar4 = 0;
  }
  offset = IR::IntConstOpnd::AsUint32(this_00);
  pOVar7 = instr->m_src2;
  if (pOVar7 != (Opnd *)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_48 = (Opnd *)0x0;
    do {
      OVar2 = IR::Opnd::GetKind(pOVar7);
      if (OVar2 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x65e8,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
        if (!bVar3) goto LAB_005bea8d;
        *puVar4 = 0;
      }
      pSVar5 = IR::Opnd::GetStackSym(pOVar7);
      if ((pSVar5->field_0x18 & 1) == 0) {
        this_02 = (Instr *)0x0;
      }
      else {
        this_02 = (pSVar5->field_5).m_instrDef;
      }
      if (this_02->m_opcode != SetConcatStrMultiItemBE) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x65ea,
                           "(concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE)",
                           "concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE");
        if (!bVar3) goto LAB_005bea8d;
        *puVar4 = 0;
      }
      pOVar7 = this_02->m_src1;
      OVar2 = IR::Opnd::GetKind(pOVar7);
      if (OVar2 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x65ed,"(concatItemOpnd->IsRegOpnd())","concatItemOpnd->IsRegOpnd()");
        if (!bVar3) goto LAB_005bea8d;
        *puVar4 = 0;
      }
      bVar3 = IR::Opnd::IsEqual(pOVar7,(Opnd *)baseOpnd);
      if (bVar3) {
        pOVar7 = local_48;
        if (local_48 == (Opnd *)0x0) {
          pIVar6 = IR::Instr::HoistSrc1(this_02,Ld_A,RegNOREG,(StackSym *)0x0);
          pOVar7 = pIVar6->m_dst;
          local_48 = pOVar7;
        }
      }
      else {
        this_01 = this->addToLiveOnBackEdgeSyms;
        pSVar5 = IR::Opnd::GetStackSym(pOVar7);
        BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pSVar5->super_Sym).m_id);
      }
      offset = offset - 1;
      dstOpnd = IR::IndirOpnd::New(baseOpnd,offset,TyVar,instr->m_func,false);
      pIVar6 = IR::Instr::New(SetConcatStrMultiItem,&dstOpnd->super_Opnd,pOVar7,instr->m_func);
      IR::Instr::InsertAfter(instr,pIVar6);
      LowerSetConcatStrMultiItem(this,pIVar6);
      pOVar7 = this_02->m_src2;
    } while (pOVar7 != (Opnd *)0x0);
  }
  if (offset != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6610,"(index == -1)","index == -1");
    if (!bVar3) {
LAB_005bea8d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  LowerNewConcatStrMulti(this,instr);
  return;
}

Assistant:

void
Lowerer::LowerNewConcatStrMultiBE(IR::Instr * instr)
{
    // Lower
    // t1 = SetConcatStrMultiBE s1
    // t2 = SetConcatStrMultiBE s2, t1
    // t3 = SetConcatStrMultiBE s3, t2
    // s  = NewConcatStrMultiBE 3, t3
    //            to
    // s   = new concat string
    // s+0 = s1
    // s+1 = s2
    // s+2 = s3
    Assert(instr->GetSrc1()->IsConstOpnd());
    Assert(instr->GetDst()->IsRegOpnd());

    IR::RegOpnd * newString = instr->GetDst()->AsRegOpnd();

    IR::Opnd * newConcatItemOpnd = nullptr;
    uint index = instr->GetSrc1()->AsIntConstOpnd()->AsUint32() - 1;
    IR::Instr * concatItemInstr = nullptr;
    IR::Opnd * linkOpnd = instr->GetSrc2();
    while (linkOpnd)
    {
        Assert(linkOpnd->IsRegOpnd());
        concatItemInstr = linkOpnd->GetStackSym()->GetInstrDef();
        Assert(concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE);

        IR::Opnd * concatItemOpnd = concatItemInstr->GetSrc1();
        Assert(concatItemOpnd->IsRegOpnd());

        // If one of the concat items is equal to the dst of the concat expressions (s = s + a + b),
        // hoist the load of that item to before the setting of the new string to the dst.
        if (concatItemOpnd->IsEqual(newString))
        {
            if (!newConcatItemOpnd)
            {
                IR::Instr * hoistSrcInstr = concatItemInstr->HoistSrc1(Js::OpCode::Ld_A);
                newConcatItemOpnd = hoistSrcInstr->GetDst();
            }
            concatItemOpnd = newConcatItemOpnd;
        }
        else
        {
            // If only some of the SetConcatStrMultiItemBE instructions were CSE'd and the rest, along with the NewConcatStrMultiBE
            // instruction, were in a loop, the strings on the CSE'd Set*BE instructions will become live on back edge. Add them to
            // addToLiveOnBackEdgeSyms here and clear when we reach the Set*BE instruction.

            // Note that we are doing this only for string opnds which are not the same as the dst of the concat expression. Reasoning
            // behind this is that if a loop has a concat expression with one of its sources same as the dst, the Set*BE instruction
            // for the dst wouldn't have been CSE'd as the dst's value is changing in the loop and the backward pass should have set the
            // symbol as live on backedge.
            this->addToLiveOnBackEdgeSyms->Set(concatItemOpnd->GetStackSym()->m_id);
        }
        IR::Instr * newConcatItemInstr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem,
                                                        IR::IndirOpnd::New(newString, index, TyVar, instr->m_func),
                                                        concatItemOpnd,
                                                        instr->m_func);
        instr->InsertAfter(newConcatItemInstr);
        this->LowerSetConcatStrMultiItem(newConcatItemInstr);

        linkOpnd = concatItemInstr->GetSrc2();
        index--;
    }
    Assert(index == -1);
    this->LowerNewConcatStrMulti(instr);
}